

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QHttpPart *part)

{
  QHttpHeaders *pQVar1;
  QHttpPartPrivate *pQVar2;
  QExplicitlySharedDataPointer<QHttpHeadersPrivate> this;
  QDebug QVar3;
  char cVar4;
  Stream *__old_val;
  long *plVar5;
  long *in_RDX;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QDebugStateSaver saver;
  QSharedDataPointer<QHttpPartPrivate> local_78;
  QDebug local_70;
  QExplicitlySharedDataPointer<QHttpHeadersPrivate> local_68;
  QHttpHeaders local_60;
  QDebug local_58;
  undefined1 *local_50;
  QSharedDataPointer<QHttpPartPrivate> local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)part);
  plVar5 = (long *)QDebug::resetFormat();
  *(undefined2 *)(*plVar5 + 0x30) = 0x100;
  pQVar2 = (part->d).d.ptr;
  QVar7.m_data = (storage_type *)0x15;
  QVar7.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_48);
  if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
    LOCK();
    *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
    UNLOCK();
    if (*(int *)local_48[0].d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
    }
  }
  pQVar2 = (part->d).d.ptr;
  if (*(char *)&(pQVar2->super_QNetworkHeadersPrivate).cookedHeaders.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  local_48[0].d.ptr = (totally_ordered_wrapper<QHttpPartPrivate_*>)(part->d).d.ptr;
  pQVar1 = &(((QHttpPartPrivate *)local_48[0].d.ptr)->super_QNetworkHeadersPrivate).httpHeaders;
  *(int *)&(pQVar1->d).d.ptr = *(int *)&(pQVar1->d).d.ptr + 1;
  local_70.stream = (Stream *)0x0;
  QtPrivate::printAssociativeContainer<QHash<QNetworkRequest::KnownHeaders,QVariant>>
            ((QtPrivate *)&local_68,(Stream *)local_48,"QHash",
             (QHash<QNetworkRequest::KnownHeaders,_QVariant> *)(*in_RDX + 0x30));
  QDebug::~QDebug((QDebug *)local_48);
  this.d.ptr = local_68.d.ptr;
  QVar8.m_data = (storage_type *)0x13;
  QVar8.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)this.d.ptr,(QString *)local_48);
  if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
    LOCK();
    *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
    UNLOCK();
    if (*(int *)local_48[0].d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
    }
  }
  if (*(char *)&(((QHttpHeadersPrivate *)((long)local_68.d.ptr + 0x20))->headers).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)local_68.d.ptr,' ');
  }
  local_60.d.d.ptr =
       (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
       (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)local_68.d.ptr;
  *(int *)((long)local_68.d.ptr + 0x28) = *(int *)((long)local_68.d.ptr + 0x28) + 1;
  operator<<((Stream *)&local_58,&local_60);
  QVar3.stream = local_58.stream;
  QVar9.m_data = (storage_type *)0x2;
  QVar9.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
  if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
    LOCK();
    *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
    UNLOCK();
    if (*(int *)local_48[0].d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
    }
  }
  if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_58.stream,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug((QDebug *)&local_60);
  QDebug::~QDebug((QDebug *)&local_68);
  QDebug::~QDebug(&local_70);
  if (*(long *)(*in_RDX + 0x68) == 0) {
    pQVar2 = (part->d).d.ptr;
    QVar13.m_data = (storage_type *)0x10;
    QVar13.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_48);
    if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
      LOCK();
      *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
      UNLOCK();
      if (*(int *)local_48[0].d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
      }
    }
    pQVar2 = (part->d).d.ptr;
    if (*(char *)&(pQVar2->super_QNetworkHeadersPrivate).cookedHeaders.d == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
    QTextStream::operator<<((QTextStream *)(part->d).d.ptr,*(longlong *)(*in_RDX + 0x60));
    pQVar2 = (part->d).d.ptr;
    if (*(char *)&(pQVar2->super_QNetworkHeadersPrivate).cookedHeaders.d == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
    pQVar2 = (part->d).d.ptr;
    QVar14.m_data = &DAT_00000006;
    QVar14.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_48);
    if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
      LOCK();
      *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
      UNLOCK();
      if (*(int *)local_48[0].d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
      }
    }
    pQVar2 = (part->d).d.ptr;
    if (*(char *)&(pQVar2->super_QNetworkHeadersPrivate).cookedHeaders.d == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
  }
  else {
    pQVar2 = (part->d).d.ptr;
    QVar10.m_data = (storage_type *)0xf;
    QVar10.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_48);
    if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
      LOCK();
      *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
      UNLOCK();
      if (*(int *)local_48[0].d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
      }
    }
    pQVar2 = (part->d).d.ptr;
    if (*(char *)&(pQVar2->super_QNetworkHeadersPrivate).cookedHeaders.d == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
    local_78.d.ptr = (totally_ordered_wrapper<QHttpPartPrivate_*>)(part->d).d.ptr;
    pQVar1 = &(((QHttpPartPrivate *)local_78.d.ptr)->super_QNetworkHeadersPrivate).httpHeaders;
    *(int *)&(pQVar1->d).d.ptr = *(int *)&(pQVar1->d).d.ptr + 1;
    operator<<((Stream *)&local_58,(QObject *)&local_78);
    QVar3.stream = local_58.stream;
    QVar11.m_data = (storage_type *)0xb;
    QVar11.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
    if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
      LOCK();
      *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
      UNLOCK();
      if (*(int *)local_48[0].d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    cVar4 = QIODevice::isOpen();
    pcVar6 = "false";
    if (cVar4 != '\0') {
      pcVar6 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,pcVar6);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar3.stream = local_58.stream;
    QVar12.m_data = (storage_type *)0x1;
    QVar12.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
    if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
      LOCK();
      *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
      UNLOCK();
      if (*(int *)local_48[0].d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  pQVar2 = (part->d).d.ptr;
  QVar15.m_data = (storage_type *)0x1;
  QVar15.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar15);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_48);
  if (local_48[0].d.ptr != (QHttpPartPrivate *)0x0) {
    LOCK();
    *(int *)local_48[0].d.ptr = *(int *)local_48[0].d.ptr + -1;
    UNLOCK();
    if (*(int *)local_48[0].d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0].d.ptr,2,0x10);
    }
  }
  pQVar2 = (part->d).d.ptr;
  if (*(char *)&(pQVar2->super_QNetworkHeadersPrivate).cookedHeaders.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (part->d).d.ptr;
  (part->d).d.ptr = (QHttpPartPrivate *)0x0;
  *(QHttpPartPrivate **)debug.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QHttpPart &part)
{
    const QDebugStateSaver saver(debug);
    debug.resetFormat().nospace().noquote();

    debug << "QHttpPart(headers = ["
          << part.d->cookedHeaders
          << "], http headers = ["
          << part.d->httpHeaders
          << "],";

    if (part.d->bodyDevice) {
        debug << " bodydevice = ["
              << part.d->bodyDevice
              << ", is open: "
              << part.d->bodyDevice->isOpen()
              << "]";
    } else {
        debug << " size of body = "
              << part.d->body.size()
              << " bytes";
    }

    debug << ")";

    return debug;
}